

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void primaryexp(LexState *ls,expdesc *v)

{
  int iVar1;
  FuncState *fs_00;
  undefined1 local_50 [8];
  expdesc key_1;
  expdesc key;
  FuncState *fs;
  expdesc *v_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  prefixexp(ls,v);
LAB_00115ca9:
  do {
    while (iVar1 = (ls->t).token, iVar1 == 0x28) {
LAB_00115d6e:
      luaK_exp2nextreg(fs_00,v);
      funcargs(ls,v);
    }
    if (iVar1 != 0x2e) {
      if (iVar1 == 0x3a) {
        luaX_next(ls);
        checkname(ls,(expdesc *)local_50);
        luaK_self(fs_00,v,(expdesc *)local_50);
        funcargs(ls,v);
      }
      else {
        if (iVar1 != 0x5b) {
          if ((iVar1 != 0x7b) && (iVar1 != 0x11e)) {
            return;
          }
          goto LAB_00115d6e;
        }
        luaK_exp2anyreg(fs_00,v);
        yindex(ls,(expdesc *)&key_1.t);
        luaK_indexed(fs_00,v,(expdesc *)&key_1.t);
      }
      goto LAB_00115ca9;
    }
    field(ls,v);
  } while( true );
}

Assistant:

static void primaryexp(LexState*ls,expdesc*v){
FuncState*fs=ls->fs;
prefixexp(ls,v);
for(;;){
switch(ls->t.token){
case'.':{
field(ls,v);
break;
}
case'[':{
expdesc key;
luaK_exp2anyreg(fs,v);
yindex(ls,&key);
luaK_indexed(fs,v,&key);
break;
}
case':':{
expdesc key;
luaX_next(ls);
checkname(ls,&key);
luaK_self(fs,v,&key);
funcargs(ls,v);
break;
}
case'(':case TK_STRING:case'{':{
luaK_exp2nextreg(fs,v);
funcargs(ls,v);
break;
}
default:return;
}
}
}